

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_follow(SessionHandle *data,char *newurl,followtype type)

{
  char cVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  char *sep;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  size_t __n;
  char *pcVar11;
  char *pcVar12;
  char cVar13;
  undefined1 local_61;
  char *local_60;
  int local_58;
  followtype local_54;
  char *local_50;
  char prot [16];
  
  if (type == FOLLOW_REDIR) {
    lVar2 = (data->set).followlocation;
    lVar3 = (data->set).maxredirs;
    if (lVar3 <= lVar2 && lVar3 != -1) {
      Curl_failf(data,"Maximum (%ld) redirects followed");
      return CURLE_TOO_MANY_REDIRECTS;
    }
    (data->state).this_is_a_follow = true;
    (data->set).followlocation = lVar2 + 1;
    if ((data->set).http_auto_referer == true) {
      if ((data->change).referer_alloc == true) {
        pcVar6 = (data->change).referer;
        if (pcVar6 != (char *)0x0) {
          (*Curl_cfree)(pcVar6);
          (data->change).referer = (char *)0x0;
        }
        (data->change).referer_alloc = false;
      }
      pcVar6 = (*Curl_cstrdup)((data->change).url);
      (data->change).referer = pcVar6;
      if (pcVar6 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (data->change).referer_alloc = true;
    }
  }
  iVar5 = __isoc99_sscanf(newurl,"%15[^?&/:]://%c",prot,&local_61);
  if (iVar5 == 2) {
    pcVar6 = strchr(newurl,0x20);
    if (pcVar6 != (char *)0x0) {
      sVar7 = strlen_url(newurl);
      pcVar6 = (char *)(*Curl_cmalloc)(sVar7 + 1);
      if (pcVar6 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      strcpy_url(pcVar6,newurl);
      (*Curl_cfree)(newurl);
      newurl = pcVar6;
    }
  }
  else {
    pcVar6 = (*Curl_cstrdup)((data->change).url);
    if (pcVar6 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    local_54 = type;
    pcVar8 = strstr(pcVar6,"//");
    pcVar11 = pcVar8 + 2;
    if (pcVar8 == (char *)0x0) {
      pcVar11 = pcVar6;
    }
    cVar1 = *newurl;
    pcVar8 = newurl;
    local_60 = pcVar11;
    local_58 = iVar5;
    if (cVar1 == '/') {
      if (newurl[1] == '/') {
        *pcVar11 = '\0';
        pcVar8 = newurl + 2;
      }
      else {
        pcVar9 = strchr(pcVar11,0x2f);
        pcVar10 = strchr(pcVar11,0x3f);
        pcVar11 = local_60;
        if (pcVar9 == (char *)0x0) {
          if (pcVar10 != (char *)0x0) {
            *pcVar10 = '\0';
          }
        }
        else {
          pcVar12 = pcVar9;
          if (pcVar10 < pcVar9) {
            pcVar12 = pcVar10;
          }
          if (pcVar10 == (char *)0x0) {
            pcVar12 = pcVar9;
          }
          *pcVar12 = '\0';
        }
      }
    }
    else {
      pcVar11 = strchr(pcVar11,0x3f);
      if (pcVar11 != (char *)0x0) {
        *pcVar11 = '\0';
        cVar1 = *newurl;
      }
      cVar13 = '?';
      if ((cVar1 != '?') &&
         (pcVar11 = strrchr(local_60,0x2f), cVar13 = cVar1, pcVar11 != (char *)0x0)) {
        *pcVar11 = '\0';
        cVar13 = *newurl;
      }
      pcVar9 = strchr(local_60,0x2f);
      local_60 = pcVar9 + 1;
      pcVar11 = local_60;
      if (pcVar9 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      if (cVar13 == '.') {
        pcVar8 = newurl + (ulong)(newurl[1] == '/') * 2;
      }
      iVar5 = 0;
      for (; ((*pcVar8 == '.' && (pcVar8[1] == '.')) && (pcVar8[2] == '/')); pcVar8 = pcVar8 + 3) {
        iVar5 = iVar5 + -1;
      }
      if (pcVar9 == (char *)0x0) {
        local_60 = (char *)0x0;
        pcVar11 = local_60;
      }
      else {
        for (; iVar5 != 0; iVar5 = iVar5 + 1) {
          pcVar9 = strrchr(pcVar11,0x2f);
          if (pcVar9 == (char *)0x0) {
            *pcVar11 = '\0';
            pcVar11 = local_60;
            break;
          }
          *pcVar9 = '\0';
        }
      }
    }
    local_60 = pcVar11;
    sVar7 = strlen_url(pcVar8);
    __n = strlen(pcVar6);
    pcVar11 = (char *)(*Curl_cmalloc)(sVar7 + __n + 2);
    if (pcVar11 == (char *)0x0) {
      (*Curl_cfree)(pcVar6);
      return CURLE_OUT_OF_MEMORY;
    }
    local_50 = pcVar6;
    memcpy(pcVar11,pcVar6,__n);
    cVar1 = *pcVar8;
    if (cVar1 != '/') {
      if (local_60 == (char *)0x0) {
        if (cVar1 != '?') goto LAB_004fd4f2;
      }
      else if ((cVar1 != '?') && (*local_60 != '\0')) {
LAB_004fd4f2:
        pcVar11[__n] = '/';
        __n = __n + 1;
      }
    }
    strcpy_url(pcVar11 + __n,pcVar8);
    (*Curl_cfree)(local_50);
    type = local_54;
    if (pcVar11 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(newurl);
    newurl = pcVar11;
    iVar5 = local_58;
  }
  if (type == FOLLOW_FAKE) {
    (data->info).wouldredirect = newurl;
    return CURLE_OK;
  }
  if (iVar5 == 2) {
    (data->state).allow_port = false;
  }
  if (((data->change).url_alloc == true) && (pcVar6 = (data->change).url, pcVar6 != (char *)0x0)) {
    (*Curl_cfree)(pcVar6);
  }
  (data->change).url = newurl;
  (data->change).url_alloc = true;
  Curl_infof(data,"Issue another request to this URL: \'%s\'\n",newurl);
  iVar5 = (data->info).httpcode;
  if (iVar5 == 0x12f) {
    if (((data->set).httpreq != HTTPREQ_GET) && (((data->set).keep_post & 4) == 0)) {
      (data->set).httpreq = HTTPREQ_GET;
      pcVar6 = "GET";
      if ((data->set).opt_no_body != false) {
        pcVar6 = "HEAD";
      }
      Curl_infof(data,"Disables POST, goes with %s\n",pcVar6);
    }
  }
  else {
    if (iVar5 == 0x12e) {
      if (((data->set).httpreq & ~HTTPREQ_GET) != HTTPREQ_POST) goto LAB_004fd643;
      bVar4 = (byte)(data->set).keep_post & 2;
    }
    else {
      if ((iVar5 != 0x12d) || (((data->set).httpreq & ~HTTPREQ_GET) != HTTPREQ_POST))
      goto LAB_004fd643;
      bVar4 = (byte)(data->set).keep_post & 1;
    }
    if (bVar4 == 0) {
      Curl_infof(data,"Switch from POST to GET\n");
      (data->set).httpreq = HTTPREQ_GET;
    }
  }
LAB_004fd643:
  Curl_pgrsTime(data,TIMER_REDIRECT);
  Curl_pgrsResetTimesSizes(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_follow(struct SessionHandle *data,
                     char *newurl, /* this 'newurl' is the Location: string,
                                      and it must be malloc()ed before passed
                                      here */
                     followtype type) /* see transfer.h */
{
#ifdef CURL_DISABLE_HTTP
  (void)data;
  (void)newurl;
  (void)type;
  /* Location: following will not happen when HTTP is disabled */
  return CURLE_TOO_MANY_REDIRECTS;
#else

  /* Location: redirect */
  bool disallowport = FALSE;

  if(type == FOLLOW_REDIR) {
    if((data->set.maxredirs != -1) &&
        (data->set.followlocation >= data->set.maxredirs)) {
      failf(data,"Maximum (%ld) redirects followed", data->set.maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }

    /* mark the next request as a followed location: */
    data->state.this_is_a_follow = TRUE;

    data->set.followlocation++; /* count location-followers */

    if(data->set.http_auto_referer) {
      /* We are asked to automatically set the previous URL as the referer
         when we get the next URL. We pick the ->url field, which may or may
         not be 100% correct */

      if(data->change.referer_alloc) {
        Curl_safefree(data->change.referer);
        data->change.referer_alloc = FALSE;
      }

      data->change.referer = strdup(data->change.url);
      if(!data->change.referer)
        return CURLE_OUT_OF_MEMORY;
      data->change.referer_alloc = TRUE; /* yes, free this later */
    }
  }

  if(!is_absolute_url(newurl))  {
    /***
     *DANG* this is an RFC 2068 violation. The URL is supposed
     to be absolute and this doesn't seem to be that!
     */
    char *absolute = concat_url(data->change.url, newurl);
    if(!absolute)
      return CURLE_OUT_OF_MEMORY;
    free(newurl);
    newurl = absolute;
  }
  else {
    /* This is an absolute URL, don't allow the custom port number */
    disallowport = TRUE;

    if(strchr(newurl, ' ')) {
      /* This new URL contains at least one space, this is a mighty stupid
         redirect but we still make an effort to do "right". */
      char *newest;
      size_t newlen = strlen_url(newurl);

      newest = malloc(newlen+1); /* get memory for this */
      if(!newest)
        return CURLE_OUT_OF_MEMORY;
      strcpy_url(newest, newurl); /* create a space-free URL */

      free(newurl); /* that was no good */
      newurl = newest; /* use this instead now */
    }

  }

  if(type == FOLLOW_FAKE) {
    /* we're only figuring out the new url if we would've followed locations
       but now we're done so we can get out! */
    data->info.wouldredirect = newurl;
    return CURLE_OK;
  }

  if(disallowport)
    data->state.allow_port = FALSE;

  if(data->change.url_alloc) {
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }

  data->change.url = newurl;
  data->change.url_alloc = TRUE;
  newurl = NULL; /* don't free! */

  infof(data, "Issue another request to this URL: '%s'\n", data->change.url);

  /*
   * We get here when the HTTP code is 300-399 (and 401). We need to perform
   * differently based on exactly what return code there was.
   *
   * News from 7.10.6: we can also get here on a 401 or 407, in case we act on
   * a HTTP (proxy-) authentication scheme other than Basic.
   */
  switch(data->info.httpcode) {
    /* 401 - Act on a WWW-Authenticate, we keep on moving and do the
       Authorization: XXXX header in the HTTP request code snippet */
    /* 407 - Act on a Proxy-Authenticate, we keep on moving and do the
       Proxy-Authorization: XXXX header in the HTTP request code snippet */
    /* 300 - Multiple Choices */
    /* 306 - Not used */
    /* 307 - Temporary Redirect */
  default:  /* for all above (and the unknown ones) */
    /* Some codes are explicitly mentioned since I've checked RFC2616 and they
     * seem to be OK to POST to.
     */
    break;
  case 301: /* Moved Permanently */
    /* (quote from RFC7231, section 6.4.2)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM)
       && !(data->set.keep_post & CURL_REDIR_POST_301)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;
  case 302: /* Found */
    /* (quote from RFC7231, section 6.4.3)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM)
       && !(data->set.keep_post & CURL_REDIR_POST_302)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;

  case 303: /* See Other */
    /* Disable both types of POSTs, unless the user explicitely
       asks for POST after POST */
    if(data->set.httpreq != HTTPREQ_GET
      && !(data->set.keep_post & CURL_REDIR_POST_303)) {
      data->set.httpreq = HTTPREQ_GET; /* enforce GET request */
      infof(data, "Disables POST, goes with %s\n",
            data->set.opt_no_body?"HEAD":"GET");
    }
    break;
  case 304: /* Not Modified */
    /* 304 means we did a conditional request and it was "Not modified".
     * We shouldn't get any Location: header in this response!
     */
    break;
  case 305: /* Use Proxy */
    /* (quote from RFC2616, section 10.3.6):
     * "The requested resource MUST be accessed through the proxy given
     * by the Location field. The Location field gives the URI of the
     * proxy.  The recipient is expected to repeat this single request
     * via the proxy. 305 responses MUST only be generated by origin
     * servers."
     */
    break;
  }
  Curl_pgrsTime(data, TIMER_REDIRECT);
  Curl_pgrsResetTimesSizes(data);

  return CURLE_OK;
#endif /* CURL_DISABLE_HTTP */
}